

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_sockets.cc
# Opt level: O3

socket_t getsock(void)

{
  int __fd;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  vw_exception *this;
  int on;
  int enableTKA;
  string local_2d0;
  undefined4 local_2b0 [4];
  ostream local_2a0;
  char local_128 [264];
  
  __fd = socket(2,1,0);
  if (-1 < __fd) {
    local_2b0[0] = 1;
    iVar1 = setsockopt(__fd,1,2,local_2b0,4);
    if (iVar1 < 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"setsockopt SO_REUSEADDR: ",0x19);
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2dca28);
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    local_128[0] = '\x01';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    iVar1 = setsockopt(__fd,1,9,local_128,4);
    if (iVar1 < 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"setsockopt SO_KEEPALIVE: ",0x19);
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2dca28);
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    return __fd;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
  std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,"socket",6);
  piVar2 = __errno_location();
  pcVar3 = local_128;
  pcVar5 = strerror_r(*piVar2,pcVar3,0x100);
  if (pcVar5 == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,"errno = ",8);
    sVar4 = strlen(pcVar3);
  }
  else {
    sVar4 = 0xf;
    pcVar3 = "errno = unknown";
  }
  std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,pcVar3,sVar4);
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
             ,0x53,&local_2d0);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

socket_t getsock()
{
  socket_t sock = socket(PF_INET, SOCK_STREAM, 0);
  if (sock < 0)
    THROWERRNO("socket");

    // SO_REUSEADDR will allow port rebinding on Windows, causing multiple instances
    // of VW on the same machine to potentially contact the wrong tree node.
#ifndef _WIN32
  int on = 1;
  if (setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (char*)&on, sizeof(on)) < 0)
    cerr << "setsockopt SO_REUSEADDR: " << strerror(errno) << endl;
#endif

  // Enable TCP Keep Alive to prevent socket leaks
  int enableTKA = 1;
  if (setsockopt(sock, SOL_SOCKET, SO_KEEPALIVE, (char*)&enableTKA, sizeof(enableTKA)) < 0)
    cerr << "setsockopt SO_KEEPALIVE: " << strerror(errno) << endl;

  return sock;
}